

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::MILSpec::TensorValue::set_allocated_longints
          (TensorValue *this,TensorValue_RepeatedLongInts *longints)

{
  ulong uVar1;
  Arena *submessage_arena;
  Arena *message_arena;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  message_arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    message_arena = *(Arena **)message_arena;
  }
  clear_value(this);
  if (longints != (TensorValue_RepeatedLongInts *)0x0) {
    submessage_arena = (Arena *)(longints->super_MessageLite)._internal_metadata_.ptr_;
    if (((ulong)submessage_arena & 2) == 0) {
      if (((ulong)submessage_arena & 1) != 0) {
        submessage_arena = *(Arena **)((ulong)submessage_arena & 0xfffffffffffffffc);
      }
    }
    else {
      submessage_arena = (Arena *)0x0;
    }
    if (message_arena != submessage_arena) {
      longints = (TensorValue_RepeatedLongInts *)
                 google::protobuf::internal::GetOwnedMessageInternal
                           (message_arena,&longints->super_MessageLite,submessage_arena);
    }
    this->_oneof_case_[0] = 5;
    (this->value_).longints_ = longints;
  }
  return;
}

Assistant:

void TensorValue::set_allocated_longints(::CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts* longints) {
  ::PROTOBUF_NAMESPACE_ID::Arena* message_arena = GetArenaForAllocation();
  clear_value();
  if (longints) {
    ::PROTOBUF_NAMESPACE_ID::Arena* submessage_arena =
      ::PROTOBUF_NAMESPACE_ID::Arena::InternalHelper<::CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts>::GetOwningArena(longints);
    if (message_arena != submessage_arena) {
      longints = ::PROTOBUF_NAMESPACE_ID::internal::GetOwnedMessage(
          message_arena, longints, submessage_arena);
    }
    set_has_longints();
    value_.longints_ = longints;
  }
  // @@protoc_insertion_point(field_set_allocated:CoreML.Specification.MILSpec.TensorValue.longInts)
}